

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VRINTX_sp(DisasContext_conflict1 *s,arg_VRINTX_sp *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  TCGTemp *ret;
  TCGTemp *ts;
  uint uVar2;
  uint uVar3;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar2 = s->isar->mvfr2 & 0xf0;
  if (0x20 < uVar2) {
    s_00 = s->uc->tcg_ctx;
    _Var1 = full_vfp_access_check(s,false);
    if (_Var1) {
      ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      uVar3 = a->vm << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          ((ulong)(uVar3 & 4) | (ulong)(uVar3 & 8) | (ulong)((uint)a->vm >> 2) << 8)
                          + 0xc10);
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
      local_48 = ret;
      local_40 = ts;
      tcg_gen_callN_aarch64(s_00,helper_rints_exact_aarch64,ret,2,&local_48);
      uVar3 = a->vd << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          ((ulong)(uVar3 & 4) | (ulong)(uVar3 & 8) | (ulong)((uint)a->vd >> 2) << 8)
                          + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,ts);
      tcg_temp_free_internal_aarch64(s_00,ret);
    }
  }
  return 0x20 < uVar2;
}

Assistant:

static bool trans_VRINTX_sp(DisasContext *s, arg_VRINTX_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i32 tmp;

    if (!dc_isar_feature(aa32_vrint, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg32(tcg_ctx, tmp, a->vm);
    fpst = get_fpstatus_ptr(tcg_ctx, false);
    gen_helper_rints_exact(tcg_ctx, tmp, tmp, fpst);
    neon_store_reg32(tcg_ctx, tmp, a->vd);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
    return true;
}